

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_replace_node(REF_CELL ref_cell,REF_INT old_node,REF_INT new_node)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (old_node != new_node) {
    pRVar1 = ref_cell->ref_adj;
    iVar3 = -1;
    if ((-1 < old_node) && (old_node < pRVar1->nnode)) {
      iVar3 = pRVar1->first[(uint)old_node];
    }
    if (iVar3 != -1) {
      uVar5 = (ulong)(uint)old_node;
      do {
        if (0 < ref_cell->node_per) {
          iVar3 = pRVar1->item[iVar3].ref;
          lVar7 = (long)iVar3;
          lVar6 = 0;
          do {
            if (ref_cell->c2n[ref_cell->size_per * lVar7 + lVar6] == old_node) {
              uVar4 = ref_adj_remove(ref_cell->ref_adj,
                                     ref_cell->c2n[ref_cell->size_per * lVar7 + lVar6],iVar3);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,0x344,"ref_cell_replace_node",(ulong)uVar4,"unregister cell");
                uVar5 = (ulong)uVar4;
              }
              if (uVar4 != 0) {
                return (REF_STATUS)uVar5;
              }
              pRVar2 = ref_cell->c2n;
              pRVar2[ref_cell->size_per * lVar7 + lVar6] = new_node;
              uVar4 = ref_adj_add(ref_cell->ref_adj,pRVar2[ref_cell->size_per * lVar7 + lVar6],iVar3
                                 );
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,0x348,"ref_cell_replace_node",(ulong)uVar4,"register cell with id");
                uVar5 = (ulong)uVar4;
              }
              if (uVar4 != 0) {
                return (REF_STATUS)uVar5;
              }
            }
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < ref_cell->node_per);
        }
        iVar3 = -1;
        if ((-1 < old_node) && (old_node < pRVar1->nnode)) {
          iVar3 = pRVar1->first[(uint)old_node];
        }
      } while (iVar3 != -1);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_node(REF_CELL ref_cell, REF_INT old_node,
                                         REF_INT new_node) {
  REF_ADJ ref_adj = ref_cell_adj(ref_cell);
  REF_INT node;
  REF_INT item, cell;

  if (old_node == new_node) return REF_SUCCESS;

  item = ref_adj_first(ref_adj, old_node);
  while (ref_adj_valid(item)) {
    cell = ref_adj_item_ref(ref_adj, item);

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (old_node == ref_cell_c2n(ref_cell, node, cell)) {
        RSS(ref_adj_remove(ref_cell->ref_adj,
                           ref_cell_c2n(ref_cell, node, cell), cell),
            "unregister cell");
        ref_cell_c2n(ref_cell, node, cell) = new_node;
        RSS(ref_adj_add(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                        cell),
            "register cell with id");
      }

    item = ref_adj_first(ref_adj, old_node);
  }

  return REF_SUCCESS;
}